

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int rrc_a(em8051 *aCPU)

{
  byte bVar1;
  uchar *puVar2;
  
  puVar2 = aCPU->mSFR;
  bVar1 = puVar2[0x60];
  puVar2[0x60] = bVar1 >> 1 | puVar2[0x50] & 0x80;
  aCPU->mSFR[0x50] = bVar1 << 7 | aCPU->mSFR[0x50] & 0x7f;
  aCPU->mPC = aCPU->mPC + 1;
  return 0;
}

Assistant:

static int rrc_a(struct em8051 *aCPU)
{
    int c = (PSW & PSWMASK_C) >> PSW_C;
    int newc = ACC & 1;
    ACC = (ACC >> 1) | (c << 7);
    PSW = (PSW & ~PSWMASK_C) | (newc << PSW_C);
    PC++;
    return 0;
}